

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplayTree.h
# Opt level: O3

void __thiscall SplayTree<unsigned_long>::rotate(SplayTree<unsigned_long> *this,Node *A,Node *B)

{
  Node *pNVar1;
  Node **ppNVar2;
  Node *pNVar3;
  
  pNVar1 = A->parent;
  if (A->left == B) {
    ppNVar2 = &B->right;
    pNVar3 = B->right;
    A->left = pNVar3;
  }
  else {
    ppNVar2 = &B->left;
    pNVar3 = B->left;
    A->right = pNVar3;
  }
  if (pNVar3 != (Node *)0x0) {
    pNVar3->parent = A;
  }
  *ppNVar2 = A;
  A->parent = B;
  if (pNVar1 == (Node *)0x0) {
    pNVar1 = (Node *)0x0;
  }
  else {
    this = (SplayTree<unsigned_long> *)&pNVar1->right;
    if (pNVar1->left == A) {
      this = (SplayTree<unsigned_long> *)&pNVar1->left;
    }
  }
  *this = (SplayTree<unsigned_long>)B;
  B->parent = pNVar1;
  return;
}

Assistant:

void rotate(Node *A, Node *B) {
    Node *parent = A->parent;

    if (A->left == B) {
      A->setL(B->right);
      B->setR(A);
    } else {
      A->setR(B->left);
      B->setL(A);
    }

    if (!parent)
      root = B, B->parent = nullptr;
    else if (parent->left == A)
      parent->setL(B);
    else
      parent->setR(B);
  }